

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall FIX::FieldBase::setString(FieldBase *this,string *string)

{
  field_metrics fVar1;
  string *string_local;
  FieldBase *this_local;
  
  std::__cxx11::string::operator=((string *)&this->m_string,(string *)string);
  fVar1 = no_metrics();
  this->m_metrics = fVar1;
  std::__cxx11::string::clear();
  return;
}

Assistant:

void setString(const std::string &string) {
    m_string = string;
    m_metrics = no_metrics();
    m_data.clear();
  }